

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_scalar_plt
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,REF_BOOL as_brick,
          char *filename)

{
  char cVar1;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_MPI pRVar2;
  bool bVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  FILE *pFVar6;
  long lVar7;
  size_t sVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  size_t sVar12;
  uint uVar13;
  REF_GLOB *l2c;
  REF_LONG ncell;
  REF_INT max_faceid;
  REF_GLOB nnode;
  int celldim;
  int numelements;
  int numpts;
  int faceneighbors;
  int varloc;
  int datapacking;
  int zonetype;
  int notused;
  int strandid;
  int parentzone;
  float zonemarker;
  REF_INT min_faceid;
  double solutiontime;
  float eohmarker;
  int numvar;
  int filetype;
  int one;
  char zonename [256];
  char default_name [1000];
  int ascii [1024];
  REF_GLOB *local_15c0;
  FILE *local_15b8;
  ulong local_15b0;
  int local_15a4;
  ulong local_15a0;
  undefined4 local_1598;
  undefined4 local_1594;
  undefined4 local_1590;
  undefined4 local_158c;
  undefined4 local_1588;
  undefined4 local_1584;
  undefined4 local_1580;
  undefined4 local_157c;
  undefined4 local_1578;
  undefined4 local_1574;
  undefined4 local_1570;
  undefined4 local_156c;
  REF_BOOL local_1568;
  uint local_1564;
  REF_DBL *local_1560;
  undefined8 local_1558;
  undefined4 local_1550;
  int local_154c;
  undefined4 local_1548;
  undefined4 local_1544;
  undefined8 local_1540;
  char local_1538 [256];
  int local_1438 [256];
  undefined8 local_1038;
  undefined4 local_1030;
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  local_1544 = 1;
  local_1548 = 0;
  local_154c = ldim + 3;
  local_1550 = 0x43b28000;
  local_1568 = as_brick;
  local_1560 = scalar;
  if (0 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"reset timing");
  }
  uVar5 = ref_node_synchronize_globals(ref_node);
  if (uVar5 == 0) {
    if (0 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"header sync global");
    }
    if (ref_mpi->id == 0) {
      pFVar6 = fopen(filename,"w");
      if (pFVar6 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10a7,"ref_gather_scalar_plt","unable to open file");
        return 2;
      }
      sVar8 = fwrite("#!TDV112",1,8,pFVar6);
      if (sVar8 != 8) {
        pcVar11 = "header";
        sVar12 = 8;
        uVar9 = 0x10a9;
        goto LAB_001356c6;
      }
      sVar8 = fwrite(&local_1544,4,1,pFVar6);
      if (sVar8 != 1) {
        pcVar11 = "magic";
        sVar12 = 1;
        uVar9 = 0x10aa;
        goto LAB_001356c6;
      }
      sVar8 = fwrite(&local_1548,4,1,pFVar6);
      if (sVar8 != 1) {
        pcVar11 = "filetype";
        sVar12 = 1;
        uVar9 = 0x10ab;
        goto LAB_001356c6;
      }
      local_1038 = 0x7400000066;
      local_1030 = 0;
      sVar8 = fwrite(&local_1038,4,3,pFVar6);
      if (sVar8 != 3) {
        pcVar11 = "title";
        sVar12 = 3;
        uVar9 = 0x10b0;
        goto LAB_001356c6;
      }
      sVar8 = fwrite(&local_154c,4,1,pFVar6);
      if (sVar8 != 1) {
        pcVar11 = "numvar";
        sVar12 = 1;
        uVar9 = 0x10b2;
        goto LAB_001356c6;
      }
      local_1038 = 0x78;
      sVar8 = fwrite(&local_1038,4,2,pFVar6);
      if (sVar8 != 2) {
        pcVar11 = "var";
        sVar12 = 2;
        uVar9 = 0x10b5;
        goto LAB_001356c6;
      }
      local_1038 = 0x79;
      sVar8 = fwrite(&local_1038,4,2,pFVar6);
      if (sVar8 != 2) {
        pcVar11 = "var";
        sVar12 = 2;
        uVar9 = 0x10b8;
        goto LAB_001356c6;
      }
      local_1038 = 0x7a;
      sVar8 = fwrite(&local_1038,4,2,pFVar6);
      if (sVar8 != 2) {
        pcVar11 = "var";
        sVar12 = 2;
        uVar9 = 0x10bb;
        goto LAB_001356c6;
      }
      if (0 < ldim) {
        local_1540 = (ulong)(uint)ldim;
        uVar10 = 0;
        local_15b8 = pFVar6;
        do {
          if (scalar_names == (char **)0x0) {
            snprintf((char *)local_1438,1000,"V%d",(ulong)((int)uVar10 + 1));
            lVar7 = 1;
            while (cVar1 = local_1538[lVar7 + 0xff], local_1438[lVar7 + 0xff] = (int)cVar1,
                  cVar1 != '\0') {
              lVar7 = lVar7 + 1;
              if (lVar7 == 0x401) {
                uVar9 = 0x10c1;
                goto LAB_0013577a;
              }
            }
          }
          else {
            pcVar11 = scalar_names[uVar10];
            lVar7 = 1;
            while (cVar1 = pcVar11[lVar7 + -1], local_1438[lVar7 + 0xff] = (int)cVar1, cVar1 != '\0'
                  ) {
              lVar7 = lVar7 + 1;
              if (lVar7 == 0x401) {
                uVar9 = 0x10c3;
LAB_0013577a:
                uVar5 = 7;
                pcVar11 = "a2i";
                uVar10 = 7;
                goto LAB_00134028;
              }
            }
          }
          sVar12 = (size_t)(int)lVar7;
          sVar8 = fwrite(&local_1038,4,sVar12,local_15b8);
          if (sVar8 != sVar12) {
            pcVar11 = "var";
            uVar9 = 0x10c5;
            goto LAB_001356c6;
          }
          uVar10 = uVar10 + 1;
          pFVar6 = local_15b8;
        } while (uVar10 != local_1540);
      }
    }
    else {
      pFVar6 = (FILE *)0x0;
    }
    if (0 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"header vars");
    }
    uVar5 = ref_grid_faceid_range(ref_grid,(REF_INT *)&local_1564,&local_15a4);
    if (uVar5 == 0) {
      if (0 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"header faceid range");
      }
      uVar13 = local_1564;
      local_15b8 = pFVar6;
      if ((int)local_1564 <= local_15a4) {
        do {
          pRVar2 = ref_grid->mpi;
          local_156c = 0x43958000;
          local_1570 = 0xffffffff;
          local_1574 = 0xffffffff;
          local_1558 = 0;
          local_1578 = 0xffffffff;
          local_1580 = 0;
          local_1584 = 0;
          local_1588 = 0;
          local_1594 = 0;
          local_1598 = 0;
          local_157c = 2;
          uVar5 = ref_grid_compact_cell_id_nodes
                            (ref_grid,ref_grid->cell[3],uVar13,(REF_GLOB *)&local_15a0,
                             (REF_LONG *)&local_15b0,&local_15c0);
          pFVar6 = local_15b8;
          if (uVar5 != 0) {
            pcVar11 = "l2c";
            uVar9 = 0xe3f;
            uVar10 = (ulong)uVar5;
LAB_00134cf6:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar9,"ref_gather_plt_tri_header",uVar10,pcVar11);
LAB_001354a2:
            pcVar11 = "plt tri header";
            uVar9 = 0x10d0;
            goto LAB_00134025;
          }
          if (0 < (long)local_15b0 && 0 < (long)local_15a0) {
            if (local_15a0 < 0x80000000) {
              local_158c = (undefined4)local_15a0;
              if (0x7fffffff < local_15b0) {
                pcVar11 = "too many tri for int";
                uVar9 = 0xe47;
                goto LAB_00134dea;
              }
              local_1590 = (undefined4)local_15b0;
              if (pRVar2->id != 0) goto joined_r0x00134584;
              sVar8 = fwrite(&local_156c,4,1,local_15b8);
              if (sVar8 == 1) {
                snprintf(local_1538,0x100,"tri%d",(ulong)uVar13);
                sVar12 = 1;
                while (cVar1 = local_1538[sVar12 - 1], local_1438[sVar12 - 1] = (int)cVar1,
                      cVar1 != '\0') {
                  sVar12 = sVar12 + 1;
                  if (sVar12 == 0x101) {
                    pcVar11 = "a2i";
                    uVar5 = 7;
                    uVar9 = 0xe4e;
                    uVar10 = 7;
                    goto LAB_00134cf6;
                  }
                }
                sVar8 = fwrite(local_1438,4,sVar12,pFVar6);
                if (sVar8 == sVar12) {
                  sVar8 = fwrite(&local_1570,4,1,pFVar6);
                  if (sVar8 == 1) {
                    sVar8 = fwrite(&local_1574,4,1,pFVar6);
                    if (sVar8 == 1) {
                      sVar8 = fwrite(&local_1558,8,1,pFVar6);
                      if (sVar8 == 1) {
                        sVar8 = fwrite(&local_1578,4,1,pFVar6);
                        if (sVar8 == 1) {
                          sVar8 = fwrite(&local_157c,4,1,pFVar6);
                          if (sVar8 == 1) {
                            sVar8 = fwrite(&local_1580,4,1,pFVar6);
                            if (sVar8 == 1) {
                              sVar8 = fwrite(&local_1584,4,1,pFVar6);
                              if (sVar8 == 1) {
                                sVar8 = fwrite(&local_1588,4,1,pFVar6);
                                if (sVar8 == 1) {
                                  sVar8 = fwrite(&local_158c,4,1,pFVar6);
                                  if (sVar8 == 1) {
                                    sVar8 = fwrite(&local_1590,4,1,pFVar6);
                                    if (sVar8 == 1) {
                                      sVar8 = fwrite(&local_1594,4,1,pFVar6);
                                      if (sVar8 == 1) {
                                        sVar8 = fwrite(&local_1594,4,1,pFVar6);
                                        if (sVar8 == 1) {
                                          sVar8 = fwrite(&local_1594,4,1,pFVar6);
                                          if (sVar8 == 1) {
                                            sVar8 = fwrite(&local_1598,4,1,pFVar6);
                                            if (sVar8 == 1) goto joined_r0x00134584;
                                            pcVar11 = "int";
                                            sVar12 = 1;
                                            uVar9 = 0xe5e;
                                          }
                                          else {
                                            pcVar11 = "int";
                                            sVar12 = 1;
                                            uVar9 = 0xe5d;
                                          }
                                        }
                                        else {
                                          pcVar11 = "int";
                                          sVar12 = 1;
                                          uVar9 = 0xe5c;
                                        }
                                      }
                                      else {
                                        pcVar11 = "int";
                                        sVar12 = 1;
                                        uVar9 = 0xe5b;
                                      }
                                    }
                                    else {
                                      pcVar11 = "int";
                                      sVar12 = 1;
                                      uVar9 = 0xe5a;
                                    }
                                  }
                                  else {
                                    pcVar11 = "int";
                                    sVar12 = 1;
                                    uVar9 = 0xe59;
                                  }
                                }
                                else {
                                  pcVar11 = "int";
                                  sVar12 = 1;
                                  uVar9 = 0xe58;
                                }
                              }
                              else {
                                pcVar11 = "int";
                                sVar12 = 1;
                                uVar9 = 0xe57;
                              }
                            }
                            else {
                              pcVar11 = "int";
                              sVar12 = 1;
                              uVar9 = 0xe56;
                            }
                          }
                          else {
                            pcVar11 = "int";
                            sVar12 = 1;
                            uVar9 = 0xe55;
                          }
                        }
                        else {
                          pcVar11 = "int";
                          sVar12 = 1;
                          uVar9 = 0xe54;
                        }
                      }
                      else {
                        pcVar11 = "double";
                        sVar12 = 1;
                        uVar9 = 0xe53;
                      }
                    }
                    else {
                      pcVar11 = "int";
                      sVar12 = 1;
                      uVar9 = 0xe52;
                    }
                  }
                  else {
                    pcVar11 = "int";
                    sVar12 = 1;
                    uVar9 = 0xe51;
                  }
                }
                else {
                  pcVar11 = "title";
                  uVar9 = 0xe4f;
                }
              }
              else {
                pcVar11 = "zonemarker";
                sVar12 = 1;
                uVar9 = 0xe4b;
              }
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar9,"ref_gather_plt_tri_header",pcVar11,sVar12,sVar8);
            }
            else {
              pcVar11 = "too many nodes for int";
              uVar9 = 0xe45;
LAB_00134dea:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar9,"ref_gather_plt_tri_header",pcVar11);
            }
            uVar5 = 1;
            goto LAB_001354a2;
          }
joined_r0x00134584:
          if (local_15c0 != (REF_GLOB *)0x0) {
            free(local_15c0);
          }
          pRVar2 = ref_grid->mpi;
          local_156c = 0x43958000;
          local_1570 = 0xffffffff;
          local_1574 = 0xffffffff;
          local_1558 = 0;
          local_1578 = 0xffffffff;
          local_1580 = 0;
          local_1584 = 0;
          local_1588 = 0;
          local_1594 = 0;
          local_1598 = 0;
          local_157c = 3;
          uVar5 = ref_grid_compact_cell_id_nodes
                            (ref_grid,ref_grid->cell[6],uVar13,(REF_GLOB *)&local_15a0,
                             (REF_LONG *)&local_15b0,&local_15c0);
          pFVar6 = local_15b8;
          if (uVar5 != 0) {
            pcVar11 = "l2c";
            uVar9 = 0xe80;
            uVar10 = (ulong)uVar5;
LAB_00134d29:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar9,"ref_gather_plt_qua_header",uVar10,pcVar11);
LAB_00135675:
            pcVar11 = "plt qua header";
            uVar9 = 0x10d1;
            goto LAB_00134025;
          }
          if (0 < (long)local_15b0 && 0 < (long)local_15a0) {
            if (local_15a0 < 0x80000000) {
              local_158c = (undefined4)local_15a0;
              if (0x7fffffff < local_15b0) {
                pcVar11 = "too many qua for int";
                uVar9 = 0xe88;
                goto LAB_00134e3a;
              }
              local_1590 = (undefined4)local_15b0;
              if (pRVar2->id != 0) goto joined_r0x001345d4;
              sVar8 = fwrite(&local_156c,4,1,local_15b8);
              if (sVar8 == 1) {
                snprintf(local_1538,0x100,"qua%d",(ulong)uVar13);
                sVar12 = 1;
                while (cVar1 = local_1538[sVar12 - 1], local_1438[sVar12 - 1] = (int)cVar1,
                      cVar1 != '\0') {
                  sVar12 = sVar12 + 1;
                  if (sVar12 == 0x101) {
                    pcVar11 = "a2i";
                    uVar5 = 7;
                    uVar9 = 0xe8f;
                    uVar10 = 7;
                    goto LAB_00134d29;
                  }
                }
                sVar8 = fwrite(local_1438,4,sVar12,pFVar6);
                if (sVar8 == sVar12) {
                  sVar8 = fwrite(&local_1570,4,1,pFVar6);
                  if (sVar8 == 1) {
                    sVar8 = fwrite(&local_1574,4,1,pFVar6);
                    if (sVar8 == 1) {
                      sVar8 = fwrite(&local_1558,8,1,pFVar6);
                      if (sVar8 == 1) {
                        sVar8 = fwrite(&local_1578,4,1,pFVar6);
                        if (sVar8 == 1) {
                          sVar8 = fwrite(&local_157c,4,1,pFVar6);
                          if (sVar8 == 1) {
                            sVar8 = fwrite(&local_1580,4,1,pFVar6);
                            if (sVar8 == 1) {
                              sVar8 = fwrite(&local_1584,4,1,pFVar6);
                              if (sVar8 == 1) {
                                sVar8 = fwrite(&local_1588,4,1,pFVar6);
                                if (sVar8 == 1) {
                                  sVar8 = fwrite(&local_158c,4,1,pFVar6);
                                  if (sVar8 == 1) {
                                    sVar8 = fwrite(&local_1590,4,1,pFVar6);
                                    if (sVar8 == 1) {
                                      sVar8 = fwrite(&local_1594,4,1,pFVar6);
                                      if (sVar8 == 1) {
                                        sVar8 = fwrite(&local_1594,4,1,pFVar6);
                                        if (sVar8 == 1) {
                                          sVar8 = fwrite(&local_1594,4,1,pFVar6);
                                          if (sVar8 == 1) {
                                            sVar8 = fwrite(&local_1598,4,1,pFVar6);
                                            if (sVar8 == 1) goto joined_r0x001345d4;
                                            pcVar11 = "int";
                                            sVar12 = 1;
                                            uVar9 = 0xe9f;
                                          }
                                          else {
                                            pcVar11 = "int";
                                            sVar12 = 1;
                                            uVar9 = 0xe9e;
                                          }
                                        }
                                        else {
                                          pcVar11 = "int";
                                          sVar12 = 1;
                                          uVar9 = 0xe9d;
                                        }
                                      }
                                      else {
                                        pcVar11 = "int";
                                        sVar12 = 1;
                                        uVar9 = 0xe9c;
                                      }
                                    }
                                    else {
                                      pcVar11 = "int";
                                      sVar12 = 1;
                                      uVar9 = 0xe9b;
                                    }
                                  }
                                  else {
                                    pcVar11 = "int";
                                    sVar12 = 1;
                                    uVar9 = 0xe9a;
                                  }
                                }
                                else {
                                  pcVar11 = "int";
                                  sVar12 = 1;
                                  uVar9 = 0xe99;
                                }
                              }
                              else {
                                pcVar11 = "int";
                                sVar12 = 1;
                                uVar9 = 0xe98;
                              }
                            }
                            else {
                              pcVar11 = "int";
                              sVar12 = 1;
                              uVar9 = 0xe97;
                            }
                          }
                          else {
                            pcVar11 = "int";
                            sVar12 = 1;
                            uVar9 = 0xe96;
                          }
                        }
                        else {
                          pcVar11 = "int";
                          sVar12 = 1;
                          uVar9 = 0xe95;
                        }
                      }
                      else {
                        pcVar11 = "double";
                        sVar12 = 1;
                        uVar9 = 0xe94;
                      }
                    }
                    else {
                      pcVar11 = "int";
                      sVar12 = 1;
                      uVar9 = 0xe93;
                    }
                  }
                  else {
                    pcVar11 = "int";
                    sVar12 = 1;
                    uVar9 = 0xe92;
                  }
                }
                else {
                  pcVar11 = "title";
                  uVar9 = 0xe90;
                }
              }
              else {
                pcVar11 = "zonemarker";
                sVar12 = 1;
                uVar9 = 0xe8c;
              }
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar9,"ref_gather_plt_qua_header",pcVar11,sVar12,sVar8);
            }
            else {
              pcVar11 = "too many nodes for int";
              uVar9 = 0xe86;
LAB_00134e3a:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar9,"ref_gather_plt_qua_header",pcVar11);
            }
            uVar5 = 1;
            goto LAB_00135675;
          }
joined_r0x001345d4:
          if (local_15c0 != (REF_GLOB *)0x0) {
            free(local_15c0);
          }
          bVar3 = (int)uVar13 < local_15a4;
          uVar13 = uVar13 + 1;
        } while (bVar3);
      }
      if (0 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"header surf");
      }
      if (local_1568 == 0) {
        uVar5 = ref_gather_plt_tet_header(ref_grid,(FILE *)pFVar6);
        if (uVar5 != 0) {
          pcVar11 = "plt tet header";
          uVar9 = 0x10d9;
          goto LAB_00134025;
        }
      }
      else {
        uVar5 = ref_gather_plt_brick_header(ref_grid,ref_grid->cell[8],(FILE *)pFVar6);
        if (uVar5 != 0) {
          pcVar11 = "plt tet brick header";
          uVar9 = 0x10d7;
          goto LAB_00134025;
        }
      }
      uVar5 = ref_gather_plt_brick_header(ref_grid,ref_grid->cell[9],(FILE *)pFVar6);
      if (uVar5 == 0) {
        uVar5 = ref_gather_plt_brick_header(ref_grid,ref_grid->cell[10],(FILE *)pFVar6);
        if (uVar5 == 0) {
          uVar5 = ref_gather_plt_brick_header(ref_grid,ref_grid->cell[0xb],(FILE *)pFVar6);
          if (uVar5 == 0) {
            if (0 < ref_mpi->timing) {
              ref_mpi_stopwatch_stop(ref_mpi,"header vol");
            }
            if ((ref_mpi->id == 0) && (sVar8 = fwrite(&local_1550,4,1,pFVar6), sVar8 != 1)) {
              pcVar11 = "eohmarker";
              sVar12 = 1;
              uVar9 = 0x10e5;
LAB_001356c6:
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar9,"ref_gather_scalar_plt",pcVar11,sVar12,sVar8);
              return 1;
            }
            if (0 < ref_mpi->timing) {
              ref_mpi_stopwatch_stop(ref_mpi,"plt end of header");
            }
            pRVar4 = local_1560;
            uVar13 = local_1564;
            if ((int)local_1564 <= local_15a4) {
              do {
                uVar5 = ref_gather_plt_tri_zone(ref_grid,uVar13,ldim,pRVar4,(FILE *)local_15b8);
                if (uVar5 != 0) {
                  pcVar11 = "plt tri zone";
                  uVar9 = 0x10ec;
                  goto LAB_00134025;
                }
                uVar5 = ref_gather_plt_qua_zone(ref_grid,uVar13,ldim,pRVar4,(FILE *)local_15b8);
                if (uVar5 != 0) {
                  pcVar11 = "plt qua zone";
                  uVar9 = 0x10ee;
                  goto LAB_00134025;
                }
                bVar3 = (int)uVar13 < local_15a4;
                uVar13 = uVar13 + 1;
              } while (bVar3);
            }
            if (0 < ref_mpi->timing) {
              ref_mpi_stopwatch_stop(ref_mpi,"surf zone");
            }
            pRVar4 = local_1560;
            pFVar6 = local_15b8;
            if (local_1568 == 0) {
              uVar5 = ref_gather_plt_tet_zone(ref_grid,ldim,local_1560,(FILE *)local_15b8);
              if (uVar5 != 0) {
                pcVar11 = "surf zone";
                uVar9 = 0x10f7;
                goto LAB_00134025;
              }
            }
            else {
              uVar5 = ref_gather_plt_brick_zone
                                (ref_grid,ref_grid->cell[8],ldim,local_1560,(FILE *)local_15b8);
              if (uVar5 != 0) {
                pcVar11 = "plt tet brick zone";
                uVar9 = 0x10f5;
                goto LAB_00134025;
              }
            }
            uVar5 = ref_gather_plt_brick_zone(ref_grid,ref_grid->cell[9],ldim,pRVar4,(FILE *)pFVar6)
            ;
            if (uVar5 == 0) {
              uVar5 = ref_gather_plt_brick_zone
                                (ref_grid,ref_grid->cell[10],ldim,pRVar4,(FILE *)pFVar6);
              if (uVar5 == 0) {
                uVar5 = ref_gather_plt_brick_zone
                                  (ref_grid,ref_grid->cell[0xb],ldim,local_1560,(FILE *)local_15b8);
                if (uVar5 == 0) {
                  if (0 < ref_mpi->timing) {
                    ref_mpi_stopwatch_stop(ref_mpi,"vol zone");
                  }
                  if (ref_mpi->id != 0) {
                    return 0;
                  }
                  fclose(local_15b8);
                  return 0;
                }
                pcVar11 = "plt hex brick zone";
                uVar9 = 0x1101;
              }
              else {
                pcVar11 = "plt pri brick zone";
                uVar9 = 0x10fe;
              }
            }
            else {
              pcVar11 = "plt pyr brick zone";
              uVar9 = 0x10fb;
            }
          }
          else {
            pcVar11 = "plt hex brick header";
            uVar9 = 0x10e0;
          }
        }
        else {
          pcVar11 = "plt pri brick header";
          uVar9 = 0x10de;
        }
      }
      else {
        pcVar11 = "plt pyr brick header";
        uVar9 = 0x10dc;
      }
    }
    else {
      pcVar11 = "range";
      uVar9 = 0x10cb;
    }
  }
  else {
    pcVar11 = "sync";
    uVar9 = 0x10a0;
  }
LAB_00134025:
  uVar10 = (ulong)uVar5;
LAB_00134028:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar9,
         "ref_gather_scalar_plt",uVar10,pcVar11);
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_scalar_plt(REF_GRID ref_grid, REF_INT ldim,
                                                REF_DBL *scalar,
                                                const char **scalar_names,
                                                REF_BOOL as_brick,
                                                const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file = NULL;
  int one = 1;
  int filetype = 0;
  int ascii[1024];
  int i, len, numvar = 3 + ldim;
  float eohmarker = 357.0;
  REF_INT cell_id, min_faceid, max_faceid;

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "reset timing");

  RSS(ref_node_synchronize_globals(ref_node), "sync");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header sync global");

  if (ref_mpi_once(ref_mpi)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    REIS(8, fwrite(&"#!TDV112", sizeof(char), 8, file), "header");
    REIS(1, fwrite(&one, sizeof(int), 1, file), "magic");
    REIS(1, fwrite(&filetype, sizeof(int), 1, file), "filetype");

    ascii[0] = (int)'f';
    ascii[1] = (int)'t';
    ascii[2] = 0;
    REIS(3, fwrite(&ascii, sizeof(int), 3, file), "title");

    REIS(1, fwrite(&numvar, sizeof(int), 1, file), "numvar");
    ascii[0] = (int)'x';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    ascii[0] = (int)'y';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    ascii[0] = (int)'z';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    for (i = 0; i < ldim; i++) {
      len = 0;
      if (NULL == scalar_names) {
        char default_name[1000];
        snprintf(default_name, 1000, "V%d", i + 1);
        RSS(ref_gather_plt_char_int(default_name, 1024, &len, ascii), "a2i");
      } else {
        RSS(ref_gather_plt_char_int(scalar_names[i], 1024, &len, ascii), "a2i");
      }
      REIS(len, fwrite(&ascii, sizeof(int), (unsigned long)len, file), "var");
    }
  }

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header vars");
  RSS(ref_grid_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header faceid range");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    RSS(ref_gather_plt_tri_header(ref_grid, cell_id, file), "plt tri header");
    RSS(ref_gather_plt_qua_header(ref_grid, cell_id, file), "plt qua header");
  }
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header surf");
  if (as_brick) {
    RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_tet(ref_grid), file),
        "plt tet brick header");
  } else {
    RSS(ref_gather_plt_tet_header(ref_grid, file), "plt tet header");
  }
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_pyr(ref_grid), file),
      "plt pyr brick header");
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_pri(ref_grid), file),
      "plt pri brick header");
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_hex(ref_grid), file),
      "plt hex brick header");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header vol");

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&eohmarker, sizeof(float), 1, file), "eohmarker");
  }
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt end of header");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    RSS(ref_gather_plt_tri_zone(ref_grid, cell_id, ldim, scalar, file),
        "plt tri zone");
    RSS(ref_gather_plt_qua_zone(ref_grid, cell_id, ldim, scalar, file),
        "plt qua zone");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "surf zone");

  if (as_brick) {
    RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_tet(ref_grid), ldim,
                                  scalar, file),
        "plt tet brick zone");
  } else {
    RSS(ref_gather_plt_tet_zone(ref_grid, ldim, scalar, file), "surf zone");
  }
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_pyr(ref_grid), ldim, scalar,
                                file),
      "plt pyr brick zone");
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_pri(ref_grid), ldim, scalar,
                                file),
      "plt pri brick zone");
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_hex(ref_grid), ldim, scalar,
                                file),
      "plt hex brick zone");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "vol zone");

  if (ref_mpi_once(ref_mpi)) {
    fclose(file);
  }

  return REF_SUCCESS;
}